

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O1

void __thiscall hwnet::TCPConnector::~TCPConnector(TCPConnector *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  Timer *this_00;
  _Manager_type p_Var3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_00123c80;
  (this->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_00123cb8;
  p_Var5 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = p_Var5->_M_use_count;
    do {
      if (iVar4 == 0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = p_Var5->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        p_Var5->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
  }
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = p_Var5->_M_use_count == 0;
  }
  this_00 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (!(bool)(this_00 == (Timer *)0x0 | bVar6)) {
    util::Timer::cancel(this_00);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var3 = (this->errorCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->errorCallback_,(_Any_data *)&this->errorCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->connectCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->connectCallback_,(_Any_data *)&this->connectCallback_,
              __destroy_functor);
  }
  p_Var5 = (this->super_enable_shared_from_this<hwnet::TCPConnector>)._M_weak_this.
           super___weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TCPConnector::~TCPConnector() {
	if(auto sp = this->connectTimer.lock()) {
		sp->cancel();
	}
}